

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectPrototypeObject.cpp
# Opt level: O0

void __thiscall
Js::ObjectPrototypeObject::PostDefineOwnProperty__proto__
          (ObjectPrototypeObject *this,RecyclableObject *obj)

{
  int iVar1;
  JavascriptLibrary *pJVar2;
  JavascriptFunction *pJVar3;
  bool local_39;
  JavascriptFunction *local_30;
  Var setter;
  Var getter;
  ScriptContext *scriptContext;
  RecyclableObject *obj_local;
  ObjectPrototypeObject *this_local;
  
  if ((ObjectPrototypeObject *)obj == this) {
    scriptContext = (ScriptContext *)obj;
    obj_local = (RecyclableObject *)this;
    getter = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    iVar1 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x15])
                      (this,0x1eb,&setter,&local_30,getter);
    local_39 = false;
    if (iVar1 != 0) {
      pJVar2 = ScriptContext::GetLibrary((ScriptContext *)getter);
      pJVar3 = JavascriptLibrary::Get__proto__getterFunction(pJVar2);
      local_39 = false;
      if ((JavascriptFunction *)setter == pJVar3) {
        pJVar2 = ScriptContext::GetLibrary((ScriptContext *)getter);
        pJVar3 = JavascriptLibrary::Get__proto__setterFunction(pJVar2);
        local_39 = local_30 == pJVar3;
      }
    }
    this->__proto__Enabled = local_39;
  }
  return;
}

Assistant:

void ObjectPrototypeObject::PostDefineOwnProperty__proto__(RecyclableObject* obj)
    {
        if (obj == this)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            Var getter, setter;

            // __proto__Enabled is now only used by diagnostics to decide displaying __proto__ or [prototype].
            // We consider __proto__ is enabled when original getter and setter are both in place.
            this->__proto__Enabled =
                this->GetAccessors(PropertyIds::__proto__, &getter, &setter, scriptContext)
                && getter == scriptContext->GetLibrary()->Get__proto__getterFunction()
                && setter == scriptContext->GetLibrary()->Get__proto__setterFunction();
        }
    }